

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams>::iterate
          (TestStatus *__return_storage_ptr__,
          DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams> *this)

{
  Context *this_00;
  TestLog *log;
  DeviceInterface *pDVar1;
  Image *this_01;
  bool bVar2;
  VkResult VVar3;
  VkQueue queue;
  Allocator *allocator;
  char *__s;
  pointer __x;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  ConstPixelBufferAccess local_128;
  ConstPixelBufferAccess renderedFrame;
  UVec4 local_d8;
  TextureLevel refImage;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  IVec3 local_84;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_DrawTestInstanceBase).super_TestInstance.m_context;
  log = this_00->m_testCtx->m_log;
  queue = Context::getUniversalQueue(this_00);
  DrawTestInstanceBase::beginRenderPass(&this->super_DrawTestInstanceBase);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x58])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawTestInstanceBase).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)*(uint *)&(this->m_data).super_DrawParamsBase.field_0x1c,
             (ulong)*(uint *)&(this->m_data).field_0x20,(ulong)*(uint *)&(this->m_data).field_0x24,
             (ulong)*(uint *)&(this->m_data).field_0x28);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x76])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4a])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&(this->super_DrawTestInstanceBase).m_cmdBuffer;
  VVar3 = (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,queue,1,&submitInfo,0);
  ::vk::checkResult(VVar3,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x29f);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DrawTestInstanceBase).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel(&refImage,&renderedFrame.m_format,0x100,0x100,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&renderedFrame,&refImage);
  local_128.m_format.order = R;
  local_128.m_format.type = SNORM_INT8;
  local_128.m_size.m_data[0] = 0;
  local_128.m_size.m_data[1] = 0x3f800000;
  tcu::clear((PixelBufferAccess *)&renderedFrame,(Vec4 *)&local_128);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (this->m_data).super_DrawParamsBase.vertices.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_start + *(uint *)&(this->m_data).field_0x24;
  if (__x != (this->m_data).super_DrawParamsBase.vertices.
             super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&vertices,&__x->position);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&colors,&__x->color);
      __x = __x + 1;
    } while (__x != (this->m_data).super_DrawParamsBase.vertices.
                    super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&renderedFrame,&refImage);
  DrawTestInstanceBase::generateRefImage
            (&this->super_DrawTestInstanceBase,(PixelBufferAccess *)&renderedFrame,&vertices,&colors
            );
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  VVar3 = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,queue);
  ::vk::checkResult(VVar3,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x2af);
  this_01 = (this->super_DrawTestInstanceBase).m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  Image::readSurface(&renderedFrame,this_01,queue,allocator,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_128,&refImage);
  if ((this->m_data).super_DrawParamsBase.topology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    local_d8.m_data[0] = 4;
    local_d8.m_data[1] = 4;
    local_d8.m_data[2] = 4;
    local_d8.m_data[3] = 4;
    local_84.m_data[0] = 1;
    local_84.m_data[1] = 1;
    local_84.m_data[2] = 0;
    bVar2 = tcu::intThresholdPositionDeviationCompare
                      (log,"Result","Image comparison result",&local_128,&renderedFrame,&local_d8,
                       &local_84,true,COMPARE_LOG_RESULT);
  }
  else {
    bVar2 = tcu::fuzzyCompare(log,"Result","Image comparison result",&local_128,&renderedFrame,0.05,
                              COMPARE_LOG_RESULT);
  }
  __s = qpGetTestResultName((uint)(bVar2 ^ 1));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,__s,(allocator<char> *)&local_d8);
  __return_storage_ptr__->m_code = (uint)(bVar2 ^ 1);
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_128.m_format,
             (undefined1 *)(local_128.m_size.m_data._0_8_ + (long)local_128.m_format));
  if (local_128.m_format != (TextureFormat)(local_128.m_size.m_data + 2)) {
    operator_delete((void *)local_128.m_format,local_128._16_8_ + 1);
  }
  if (colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(colors.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)colors.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)colors.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::TextureLevel::~TextureLevel(&refImage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawTestInstance<DrawParams>::iterate (void)
{
	tcu::TestLog			&log				= m_context.getTestContext().getLog();
	const vk::VkQueue		queue				= m_context.getUniversalQueue();

	beginRenderPass();

	const vk::VkDeviceSize	vertexBufferOffset	= 0;
	const vk::VkBuffer		vertexBuffer		= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
	m_vk.cmdDraw(*m_cmdBuffer, m_data.params.vertexCount, m_data.params.instanceCount, m_data.params.firstVertex, m_data.params.firstInstance);
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo	submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0,											// deUint32					waitSemaphoreCount;
		DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,											// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
		0,											// deUint32					signalSemaphoreCount;
		DE_NULL										// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	// Validation
	tcu::TextureLevel refImage (vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	tcu::clear(refImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	std::vector<tcu::Vec4>	vertices;
	std::vector<tcu::Vec4>	colors;

	for (std::vector<PositionColorVertex>::const_iterator vertex = m_data.vertices.begin() + m_data.params.firstVertex; vertex != m_data.vertices.end(); ++vertex)
	{
		vertices.push_back(vertex->position);
		colors.push_back(vertex->color);
	}
	generateRefImage(refImage.getAccess(), vertices, colors);

	VK_CHECK(m_vk.queueWaitIdle(queue));

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!imageCompare(log, refImage.getAccess(), renderedFrame, m_data.topology))
		res = QP_TEST_RESULT_FAIL;

	return tcu::TestStatus(res, qpGetTestResultName(res));
}